

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O0

void nes_stream_update_nsfplay(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  int local_48;
  int local_44;
  INT32 Buffer [4];
  uint local_2c;
  UINT32 CurSmpl;
  NESAPU_INF *info;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *chip_local;
  
  for (local_2c = 0; local_2c < samples; local_2c = local_2c + 1) {
    NES_APU_np_Render(*(void **)((long)chip + 8),&local_48);
    NES_DMC_np_Render(*(void **)((long)chip + 0x10),Buffer);
    (*outputs)[local_2c] = local_48 + Buffer[0];
    outputs[1][local_2c] = local_44 + Buffer[1];
  }
  if (*(long *)((long)chip + 0x18) != 0) {
    nes_render_fds(*(void **)((long)chip + 0x18),samples,outputs);
  }
  return;
}

Assistant:

static void nes_stream_update_nsfplay(void* chip, UINT32 samples, DEV_SMPL** outputs)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	UINT32 CurSmpl;
	INT32 Buffer[4];
	
	for (CurSmpl = 0; CurSmpl < samples; CurSmpl ++)
	{
		NES_APU_np_Render(info->chip_apu, &Buffer[0]);
		NES_DMC_np_Render(info->chip_dmc, &Buffer[2]);
		outputs[0][CurSmpl] = Buffer[0] + Buffer[2];
		outputs[1][CurSmpl] = Buffer[1] + Buffer[3];
	}
	
#ifdef EC_NES_NSFP_FDS
	if (info->chip_fds != NULL)
		nes_render_fds(info->chip_fds, samples, outputs);
#endif
	
	return;
}